

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O2

void __thiscall VcprojGenerator::initRootFiles(VcprojGenerator *this)

{
  QMakeProject *this_00;
  ProStringList *fileList;
  long in_FS_OFFSET;
  ProKey PStack_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey(&PStack_58,"RC_FILE");
  fileList = QMakeEvaluator::valuesRef(&this_00->super_QMakeEvaluator,&PStack_58);
  VCFilter::addFiles(&(this->vcProject).RootFiles,fileList);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&PStack_58);
  (this->vcProject).RootFiles.Project = this;
  (this->vcProject).RootFiles.Config = &(this->vcProject).Configuration;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VcprojGenerator::initRootFiles()
{
    // Note: Root files do _not_ have any filter name, filter nor GUID!
    vcProject.RootFiles.addFiles(project->values("RC_FILE"));

    vcProject.RootFiles.Project = this;
    vcProject.RootFiles.Config = &(vcProject.Configuration);
}